

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O2

UnicodeString *
icu_63::DateFormat::getBestPattern
          (UnicodeString *__return_storage_ptr__,Locale *locale,UnicodeString *skeleton,
          UErrorCode *status)

{
  UnifiedCache *this;
  DateFmtBestPattern *patternPtr;
  DateFmtBestPatternKey key;
  DateFmtBestPattern *local_168;
  DateFmtBestPatternKey local_160;
  
  this = UnifiedCache::getInstance(status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    DateFmtBestPatternKey::DateFmtBestPatternKey(&local_160,locale,skeleton,status);
    local_168 = (DateFmtBestPattern *)0x0;
    UnifiedCache::get<icu_63::DateFmtBestPattern>
              (this,(CacheKey<icu_63::DateFmtBestPattern> *)&local_160,&local_168,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&local_168->fPattern);
      SharedObject::removeRef(&local_168->super_SharedObject);
    }
    else {
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_00471e80;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    }
    DateFmtBestPatternKey::~DateFmtBestPatternKey(&local_160);
  }
  else {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00471e80;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString U_EXPORT2
DateFormat::getBestPattern(
        const Locale &locale,
        const UnicodeString &skeleton,
        UErrorCode &status) {
    UnifiedCache *cache = UnifiedCache::getInstance(status);
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    DateFmtBestPatternKey key(locale, skeleton, status);
    const DateFmtBestPattern *patternPtr = NULL;
    cache->get(key, patternPtr, status);
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    UnicodeString result(patternPtr->fPattern);
    patternPtr->removeRef();
    return result;
}